

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_8_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  float *data;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  float *pfVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  float *pfVar40;
  long lVar41;
  long lVar42;
  int k_count;
  int iVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  int iVar47;
  float *pfVar48;
  byte bVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [12];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  float fVar90;
  undefined1 auVar91 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  int data_width;
  float local_108;
  
  auVar57._8_4_ = 0x80000000;
  auVar57._0_8_ = 0x8000000080000000;
  auVar57._12_4_ = 0x80000000;
  auVar88 = ZEXT1664(auVar57);
  auVar58._8_4_ = 0x3effffff;
  auVar58._0_8_ = 0x3effffff3effffff;
  auVar58._12_4_ = 0x3effffff;
  auVar91 = ZEXT1664(auVar58);
  fVar64 = ipoint->scale;
  auVar94 = ZEXT464((uint)fVar64);
  auVar50 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)fVar64),auVar57,0xf8);
  auVar50 = ZEXT416((uint)(fVar64 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  iVar38 = (int)auVar50._0_4_;
  fVar62 = -0.08 / (fVar64 * fVar64);
  auVar51 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)ipoint->x),auVar57,0xf8);
  auVar51 = ZEXT416((uint)(ipoint->x + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar53._0_8_ = (double)auVar51._0_4_;
  auVar53._8_8_ = auVar51._8_8_;
  auVar56._0_8_ = (double)fVar64;
  auVar56._8_8_ = 0;
  auVar51 = vfmadd231sd_fma(auVar53,auVar56,ZEXT816(0x3fe0000000000000));
  auVar55._0_4_ = (float)auVar51._0_8_;
  auVar55._4_12_ = auVar51._4_12_;
  auVar51 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)ipoint->y),auVar57,0xf8);
  auVar51 = ZEXT416((uint)(ipoint->y + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52._0_8_ = (double)auVar51._0_4_;
  auVar52._8_8_ = auVar51._8_8_;
  auVar51 = vfmadd231sd_fma(auVar52,auVar56,ZEXT816(0x3fe0000000000000));
  auVar54._0_4_ = (float)auVar51._0_8_;
  auVar54._4_12_ = auVar51._4_12_;
  auVar51._0_4_ = (int)auVar50._0_4_;
  auVar51._4_4_ = (int)auVar50._4_4_;
  auVar51._8_4_ = (int)auVar50._8_4_;
  auVar51._12_4_ = (int)auVar50._12_4_;
  auVar50 = vcvtdq2ps_avx(auVar51);
  fVar3 = auVar55._0_4_ - auVar50._0_4_;
  auVar53 = ZEXT416((uint)fVar3);
  fVar4 = auVar54._0_4_ - auVar50._0_4_;
  auVar50 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar64),auVar55);
  auVar51 = vpternlogd_avx512vl(auVar58,auVar50,auVar57,0xf8);
  auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar51._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = ZEXT416((uint)fVar64);
  if (iVar38 < (int)auVar50._0_4_) {
    auVar50 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar51,auVar54);
    auVar59._8_4_ = 0x3effffff;
    auVar59._0_8_ = 0x3effffff3effffff;
    auVar59._12_4_ = 0x3effffff;
    auVar60._8_4_ = 0x80000000;
    auVar60._0_8_ = 0x8000000080000000;
    auVar60._12_4_ = 0x80000000;
    auVar52 = vpternlogd_avx512vl(auVar60,auVar50,auVar59,0xea);
    auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar52._0_4_));
    auVar50 = vroundss_avx(auVar50,auVar50,0xb);
    if (iVar38 < (int)auVar50._0_4_) {
      auVar50 = vfmadd231ss_fma(auVar55,auVar51,ZEXT416(0x41300000));
      auVar61._8_4_ = 0x80000000;
      auVar61._0_8_ = 0x8000000080000000;
      auVar61._12_4_ = 0x80000000;
      auVar52 = vpternlogd_avx512vl(auVar61,auVar50,auVar59,0xea);
      auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar52._0_4_));
      auVar50 = vroundss_avx(auVar50,auVar50,0xb);
      if ((int)auVar50._0_4_ + iVar38 <= iimage->width) {
        auVar50 = vfmadd231ss_fma(auVar54,auVar51,ZEXT416(0x41300000));
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar52 = vpternlogd_avx512vl(auVar59,auVar50,auVar12,0xf8);
        auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar52._0_4_));
        auVar50 = vroundss_avx(auVar50,auVar50,0xb);
        if ((int)auVar50._0_4_ + iVar38 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar40 = iimage->data;
          iVar1 = iimage->data_width;
          iVar47 = iVar38 * 2;
          pfVar34 = haarResponseY + 0x1f;
          pfVar48 = haarResponseX + 0x1f;
          uVar23 = 0xfffffff4;
          do {
            auVar50._0_4_ = (float)(int)uVar23;
            auVar50._4_12_ = in_ZMM8._4_12_;
            auVar50 = vfmadd213ss_fma(auVar50,auVar51,ZEXT416((uint)(fVar4 + 0.5)));
            iVar17 = (int)auVar50._0_4_;
            auVar76._0_4_ = (float)(int)(uVar23 | 1);
            auVar76._4_12_ = in_ZMM8._4_12_;
            auVar50 = vfmadd213ss_fma(auVar76,auVar51,ZEXT416((uint)(fVar4 + 0.5)));
            iVar19 = (int)auVar50._0_4_;
            iVar18 = (iVar17 + -1) * iVar1;
            iVar16 = (iVar17 + -1 + iVar38) * iVar1;
            iVar20 = (iVar17 + -1 + iVar47) * iVar1;
            iVar21 = (iVar19 + -1) * iVar1;
            iVar17 = (iVar19 + -1 + iVar38) * iVar1;
            iVar19 = (iVar19 + -1 + iVar47) * iVar1;
            lVar29 = 0;
            do {
              iVar43 = (int)lVar29;
              auVar77._0_4_ = (float)(iVar43 + -0xc);
              auVar77._4_12_ = in_ZMM8._4_12_;
              auVar50 = vfmadd213ss_fma(auVar77,auVar51,ZEXT416((uint)fVar3));
              iVar26 = (int)auVar50._0_4_;
              auVar78._0_4_ = (float)(iVar43 + -0xb);
              auVar89 = auVar91._4_12_;
              auVar78._4_12_ = auVar89;
              auVar50 = vfmadd213ss_fma(auVar78,auVar51,ZEXT416((uint)fVar3));
              iVar37 = (int)auVar50._0_4_;
              auVar79._0_4_ = (float)(iVar43 + -10);
              auVar79._4_12_ = auVar89;
              auVar52 = ZEXT416((uint)fVar3);
              auVar50 = vfmadd213ss_fma(auVar79,auVar51,auVar52);
              iVar45 = (int)auVar50._0_4_;
              auVar80._0_4_ = (float)(iVar43 + -9);
              auVar80._4_12_ = auVar89;
              auVar50 = vfmadd213ss_fma(auVar80,auVar51,auVar52);
              iVar31 = (int)auVar50._0_4_;
              auVar87._0_4_ = (float)(iVar43 + -8);
              auVar87._4_12_ = auVar89;
              auVar86._0_4_ = (float)(iVar43 + -7);
              auVar86._4_12_ = auVar89;
              auVar85._0_4_ = (float)(iVar43 + -6);
              auVar85._4_12_ = auVar89;
              auVar81._0_4_ = (float)(iVar43 + -5);
              auVar81._4_12_ = auVar89;
              iVar33 = iVar26 + -1 + iVar38;
              iVar22 = iVar26 + -1 + iVar47;
              fVar64 = pfVar40[iVar16 + -1 + iVar26];
              fVar63 = pfVar40[iVar20 + -1 + iVar26];
              fVar69 = pfVar40[iVar20 + iVar22];
              fVar73 = pfVar40[iVar18 + -1 + iVar26];
              fVar82 = pfVar40[iVar18 + iVar22];
              auVar54 = SUB6416(ZEXT464(0x40000000),0);
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar33] -
                                                      pfVar40[iVar20 + iVar33])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar16 + iVar22];
              pfVar48[lVar29 + -0x1f] = (fVar63 - fVar82) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -0x1f] = auVar50._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar17 + -1 + iVar26];
              fVar63 = pfVar40[iVar19 + -1 + iVar26];
              fVar69 = pfVar40[iVar22 + iVar19];
              auVar50 = vfmadd213ss_fma(auVar87,auVar51,auVar52);
              fVar73 = pfVar40[iVar21 + -1 + iVar26];
              fVar82 = pfVar40[iVar21 + iVar22];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar21 + iVar33] -
                                                      pfVar40[iVar33 + iVar19])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar17 + iVar22];
              pfVar48[lVar29 + -7] = (fVar63 - fVar82) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              iVar33 = iVar37 + -1 + iVar38;
              iVar22 = iVar37 + -1 + iVar47;
              pfVar34[lVar29 + -7] = auVar53._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar16 + -1 + iVar37];
              fVar63 = pfVar40[iVar20 + -1 + iVar37];
              fVar69 = pfVar40[iVar20 + iVar22];
              fVar73 = pfVar40[iVar18 + -1 + iVar37];
              fVar82 = pfVar40[iVar18 + iVar22];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar33] -
                                                      pfVar40[iVar20 + iVar33])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar16 + iVar22];
              pfVar48[lVar29 + -0x1e] = (fVar63 - fVar82) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -0x1e] = auVar53._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar17 + -1 + iVar37];
              fVar63 = pfVar40[iVar19 + -1 + iVar37];
              fVar69 = pfVar40[iVar22 + iVar19];
              iVar26 = (int)auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(auVar86,auVar51,auVar52);
              fVar73 = pfVar40[iVar21 + -1 + iVar37];
              fVar82 = pfVar40[iVar21 + iVar22];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar21 + iVar33] -
                                                      pfVar40[iVar33 + iVar19])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar17 + iVar22];
              pfVar48[lVar29 + -6] = (fVar63 - fVar82) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -6] = auVar53._0_4_ - (fVar63 - fVar82);
              iVar33 = iVar45 + -1 + iVar38;
              iVar22 = iVar45 + -1 + iVar47;
              fVar64 = pfVar40[iVar16 + -1 + iVar45];
              fVar63 = pfVar40[iVar20 + -1 + iVar45];
              fVar69 = pfVar40[iVar20 + iVar22];
              fVar73 = pfVar40[iVar18 + -1 + iVar45];
              fVar82 = pfVar40[iVar18 + iVar22];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar33] -
                                                      pfVar40[iVar20 + iVar33])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar16 + iVar22];
              pfVar48[lVar29 + -0x1d] = (fVar63 - fVar82) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -0x1d] = auVar53._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar17 + -1 + iVar45];
              fVar63 = pfVar40[iVar19 + -1 + iVar45];
              fVar69 = pfVar40[iVar22 + iVar19];
              iVar37 = (int)auVar50._0_4_;
              fVar73 = pfVar40[iVar21 + -1 + iVar45];
              fVar82 = pfVar40[iVar21 + iVar22];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar21 + iVar33] -
                                                      pfVar40[iVar33 + iVar19])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar17 + iVar22];
              pfVar48[lVar29 + -5] = (fVar63 - fVar82) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -5] = auVar50._0_4_ - (fVar63 - fVar82);
              iVar22 = iVar31 + -1 + iVar38;
              iVar45 = iVar31 + -1 + iVar47;
              fVar64 = pfVar40[iVar16 + -1 + iVar31];
              fVar63 = pfVar40[iVar20 + -1 + iVar31];
              fVar69 = pfVar40[iVar20 + iVar45];
              fVar73 = pfVar40[iVar18 + -1 + iVar31];
              fVar82 = pfVar40[iVar18 + iVar45];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar22] -
                                                      pfVar40[iVar20 + iVar22])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar16 + iVar45];
              pfVar48[lVar29 + -0x1c] = (fVar63 - fVar82) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -0x1c] = auVar50._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar17 + -1 + iVar31];
              fVar63 = pfVar40[iVar19 + -1 + iVar31];
              fVar69 = pfVar40[iVar45 + iVar19];
              auVar50 = vfmadd213ss_fma(auVar85,auVar51,ZEXT416((uint)fVar3));
              fVar73 = pfVar40[iVar21 + -1 + iVar31];
              fVar82 = pfVar40[iVar21 + iVar45];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar21 + iVar22] -
                                                      pfVar40[iVar22 + iVar19])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar17 + iVar45];
              pfVar48[lVar29 + -4] = (fVar63 - fVar82) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              iVar22 = iVar26 + -1 + iVar38;
              iVar45 = iVar26 + -1 + iVar47;
              pfVar34[lVar29 + -4] = auVar53._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar16 + -1 + iVar26];
              fVar63 = pfVar40[iVar20 + -1 + iVar26];
              fVar69 = pfVar40[iVar20 + iVar45];
              fVar73 = pfVar40[iVar18 + -1 + iVar26];
              fVar82 = pfVar40[iVar18 + iVar45];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar22] -
                                                      pfVar40[iVar20 + iVar22])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar16 + iVar45];
              pfVar48[lVar29 + -0x1b] = (fVar63 - fVar82) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -0x1b] = auVar53._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar17 + -1 + iVar26];
              fVar63 = pfVar40[iVar19 + -1 + iVar26];
              in_ZMM8 = ZEXT464((uint)pfVar40[iVar45 + iVar19]);
              iVar31 = (int)auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(auVar81,auVar51,ZEXT416((uint)fVar3));
              fVar69 = pfVar40[iVar21 + iVar45];
              auVar52 = ZEXT416((uint)(pfVar40[iVar45 + iVar19] - pfVar40[iVar21 + -1 + iVar26]));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar21 + iVar22] -
                                                      pfVar40[iVar22 + iVar19])),auVar54,auVar52);
              fVar73 = pfVar40[iVar17 + iVar45];
              pfVar48[lVar29 + -3] = (fVar63 - fVar69) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar73)),auVar54,auVar52);
              pfVar34[lVar29 + -3] = auVar53._0_4_ - (fVar63 - fVar69);
              iVar22 = iVar37 + -1 + iVar38;
              iVar45 = iVar37 + -1 + iVar47;
              fVar64 = pfVar40[iVar16 + -1 + iVar37];
              fVar63 = pfVar40[iVar20 + -1 + iVar37];
              fVar69 = pfVar40[iVar20 + iVar45];
              fVar73 = pfVar40[iVar18 + -1 + iVar37];
              fVar82 = pfVar40[iVar18 + iVar45];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar22] -
                                                      pfVar40[iVar20 + iVar22])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar16 + iVar45];
              pfVar48[lVar29 + -0x1a] = (fVar63 - fVar82) + auVar53._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -0x1a] = auVar53._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar17 + -1 + iVar37];
              fVar63 = pfVar40[iVar19 + -1 + iVar37];
              auVar91 = ZEXT464((uint)pfVar40[iVar45 + iVar19]);
              iVar26 = (int)auVar50._0_4_;
              fVar69 = pfVar40[iVar21 + iVar45];
              auVar53 = ZEXT416((uint)(pfVar40[iVar45 + iVar19] - pfVar40[iVar21 + -1 + iVar37]));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar21 + iVar22] -
                                                      pfVar40[iVar22 + iVar19])),auVar54,auVar53);
              fVar73 = pfVar40[iVar17 + iVar45];
              pfVar48[lVar29 + -2] = (fVar63 - fVar69) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar73)),auVar54,auVar53);
              pfVar34[lVar29 + -2] = auVar50._0_4_ - (fVar63 - fVar69);
              iVar22 = iVar31 + -1 + iVar38;
              iVar45 = iVar31 + -1 + iVar47;
              fVar64 = pfVar40[iVar16 + -1 + iVar31];
              fVar63 = pfVar40[iVar20 + -1 + iVar31];
              fVar69 = pfVar40[iVar20 + iVar45];
              fVar73 = pfVar40[iVar18 + -1 + iVar31];
              fVar82 = pfVar40[iVar18 + iVar45];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar22] -
                                                      pfVar40[iVar20 + iVar22])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar16 + iVar45];
              pfVar48[lVar29 + -0x19] = (fVar63 - fVar82) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -0x19] = auVar50._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar17 + -1 + iVar31];
              fVar63 = pfVar40[iVar19 + -1 + iVar31];
              fVar69 = pfVar40[iVar45 + iVar19];
              fVar73 = pfVar40[iVar21 + -1 + iVar31];
              fVar82 = pfVar40[iVar21 + iVar45];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar21 + iVar22] -
                                                      pfVar40[iVar22 + iVar19])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar17 + iVar45];
              pfVar48[lVar29 + -1] = (fVar63 - fVar82) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -1] = auVar50._0_4_ - (fVar63 - fVar82);
              iVar31 = iVar26 + -1 + iVar38;
              iVar45 = iVar26 + -1 + iVar47;
              fVar64 = pfVar40[iVar16 + -1 + iVar26];
              fVar63 = pfVar40[iVar20 + -1 + iVar26];
              fVar69 = pfVar40[iVar20 + iVar45];
              fVar73 = pfVar40[iVar18 + -1 + iVar26];
              fVar82 = pfVar40[iVar18 + iVar45];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar18 + iVar31] -
                                                      pfVar40[iVar20 + iVar31])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              fVar70 = pfVar40[iVar16 + iVar45];
              pfVar48[lVar29 + -0x18] = (fVar63 - fVar82) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29 + -0x18] = auVar50._0_4_ - (fVar63 - fVar82);
              fVar64 = pfVar40[iVar17 + -1 + iVar26];
              fVar63 = pfVar40[iVar19 + -1 + iVar26];
              fVar69 = pfVar40[iVar45 + iVar19];
              fVar73 = pfVar40[iVar21 + -1 + iVar26];
              fVar82 = pfVar40[iVar21 + iVar45];
              fVar70 = pfVar40[iVar17 + iVar45];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar21 + iVar31] -
                                                      pfVar40[iVar31 + iVar19])),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar48[lVar29] = (fVar63 - fVar82) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar70)),auVar54,
                                        ZEXT416((uint)(fVar69 - fVar73)));
              pfVar34[lVar29] = auVar50._0_4_ - (fVar63 - fVar82);
              lVar29 = lVar29 + 8;
            } while (iVar43 + -0xc < 4);
            pfVar34 = pfVar34 + 0x30;
            pfVar48 = pfVar48 + 0x30;
            bVar2 = (int)uVar23 < 10;
            uVar23 = uVar23 + 2;
          } while (bVar2);
          goto LAB_001c6ab7;
        }
      }
    }
  }
  iVar1 = iVar38 * 2;
  lVar29 = 0;
  uVar23 = 0xfffffff4;
  do {
    auVar65._0_4_ = (float)(int)uVar23;
    auVar65._4_12_ = in_ZMM8._4_12_;
    auVar50 = vfmadd213ss_fma(auVar65,auVar94._0_16_,ZEXT416((uint)fVar4));
    auVar67._0_4_ = (float)(int)(uVar23 | 1);
    auVar67._4_12_ = in_ZMM8._4_12_;
    auVar52 = vfmadd213ss_fma(auVar67,auVar94._0_16_,ZEXT416((uint)fVar4));
    fVar63 = auVar50._0_4_;
    iVar43 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
    fVar63 = auVar52._0_4_;
    iVar45 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
    iVar16 = iVar1 + iVar43;
    iVar17 = iVar43 + -1;
    iVar18 = iVar43 + -1 + iVar38;
    iVar19 = iVar1 + iVar45;
    iVar20 = iVar45 + -1;
    iVar21 = iVar45 + -1 + iVar38;
    lVar28 = lVar29;
    iVar47 = -0xc;
    do {
      auVar66._0_4_ = (float)iVar47;
      auVar89 = auVar88._4_12_;
      auVar66._4_12_ = auVar89;
      auVar55 = auVar94._0_16_;
      auVar50 = vfmadd213ss_fma(auVar66,auVar55,auVar53);
      auVar83._0_4_ = (float)(iVar47 + 1);
      auVar83._4_12_ = auVar89;
      auVar52 = vfmadd213ss_fma(auVar83,auVar55,auVar53);
      auVar74._0_4_ = (float)(iVar47 + 2);
      auVar74._4_12_ = auVar89;
      auVar54 = vfmadd213ss_fma(auVar74,auVar55,auVar53);
      auVar71._0_4_ = (float)(iVar47 + 3);
      auVar71._4_12_ = auVar89;
      auVar55 = vfmadd213ss_fma(auVar71,auVar55,auVar53);
      fVar63 = auVar50._0_4_;
      fVar82 = auVar52._0_4_;
      fVar73 = auVar54._0_4_;
      fVar69 = auVar55._0_4_;
      pfVar40 = (float *)((long)haarResponseY + lVar28);
      iVar31 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
      if ((((iVar43 < 1) || (iVar31 < 1)) || (iimage->height < iVar16)) ||
         (iVar22 = iVar1 + iVar31, iimage->width < iVar22)) {
        haarXY(iimage,iVar43,iVar31,iVar38,(float *)((long)haarResponseX + lVar28),pfVar40);
      }
      else {
        iVar33 = iVar31 + -1 + iVar38;
        pfVar48 = iimage->data;
        iVar37 = iimage->data_width;
        iVar26 = iVar37 * iVar17;
        fVar63 = pfVar48[iVar37 * iVar18 + -1 + iVar31];
        iVar35 = iVar37 * (iVar1 + -1 + iVar43);
        fVar70 = pfVar48[iVar35 + -1 + iVar31];
        fVar5 = pfVar48[iVar35 + -1 + iVar22];
        fVar6 = pfVar48[iVar26 + -1 + iVar31];
        fVar7 = pfVar48[iVar26 + -1 + iVar22];
        fVar8 = pfVar48[iVar37 * iVar18 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar26 + iVar33] - pfVar48[iVar35 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *(float *)((long)haarResponseX + lVar28) = (fVar70 - fVar7) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar40 = auVar50._0_4_ - (fVar70 - fVar7);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x60);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x60);
      if (((iVar45 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar19 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar45,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar26 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar35 = iVar37 * iVar20;
        fVar63 = pfVar34[iVar37 * iVar21 + -1 + iVar31];
        iVar33 = iVar37 * (iVar1 + -1 + iVar45);
        fVar70 = pfVar34[iVar33 + -1 + iVar31];
        fVar5 = pfVar34[iVar33 + -1 + iVar22];
        fVar6 = pfVar34[iVar35 + -1 + iVar31];
        fVar7 = pfVar34[iVar35 + -1 + iVar22];
        fVar8 = pfVar34[iVar37 * iVar21 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar26] - pfVar34[iVar33 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar40 = (fVar70 - fVar7) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar48 = auVar50._0_4_ - (fVar70 - fVar7);
      }
      iVar31 = (int)((double)((ulong)(0.0 <= fVar82) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar82) * -0x4020000000000000) + (double)fVar82);
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 4);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 4);
      if (((iVar43 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar16 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar43,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar33 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar26 = iVar37 * iVar17;
        fVar63 = pfVar34[iVar37 * iVar18 + -1 + iVar31];
        iVar35 = iVar37 * (iVar1 + -1 + iVar43);
        fVar82 = pfVar34[iVar35 + -1 + iVar31];
        fVar70 = pfVar34[iVar35 + -1 + iVar22];
        fVar5 = pfVar34[iVar26 + -1 + iVar31];
        fVar6 = pfVar34[iVar26 + -1 + iVar22];
        fVar7 = pfVar34[iVar37 * iVar18 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar26 + iVar33] - pfVar34[iVar35 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar5)));
        *pfVar40 = (fVar82 - fVar6) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar5)));
        *pfVar48 = auVar50._0_4_ - (fVar82 - fVar6);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 100);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 100);
      if ((((iVar45 < 1) || (iVar31 < 1)) || (iimage->height < iVar19)) ||
         (iVar22 = iVar1 + iVar31, iimage->width < iVar22)) {
        haarXY(iimage,iVar45,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar26 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar35 = iVar37 * iVar20;
        fVar63 = pfVar34[iVar37 * iVar21 + -1 + iVar31];
        iVar33 = iVar37 * (iVar1 + -1 + iVar45);
        fVar82 = pfVar34[iVar33 + -1 + iVar31];
        fVar70 = pfVar34[iVar33 + -1 + iVar22];
        fVar5 = pfVar34[iVar35 + -1 + iVar31];
        fVar6 = pfVar34[iVar35 + -1 + iVar22];
        fVar7 = pfVar34[iVar37 * iVar21 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar26] - pfVar34[iVar33 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar5)));
        *pfVar40 = (fVar82 - fVar6) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar5)));
        *pfVar48 = auVar50._0_4_ - (fVar82 - fVar6);
      }
      iVar31 = (int)((double)((ulong)(0.0 <= fVar73) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar73) * -0x4020000000000000) + (double)fVar73);
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 8);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 8);
      if (((iVar43 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar16 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar43,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar33 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar26 = iVar37 * iVar17;
        fVar63 = pfVar34[iVar37 * iVar18 + -1 + iVar31];
        iVar35 = iVar37 * (iVar1 + -1 + iVar43);
        fVar73 = pfVar34[iVar35 + -1 + iVar31];
        fVar82 = pfVar34[iVar35 + -1 + iVar22];
        fVar70 = pfVar34[iVar26 + -1 + iVar31];
        fVar5 = pfVar34[iVar26 + -1 + iVar22];
        fVar6 = pfVar34[iVar37 * iVar18 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar26 + iVar33] - pfVar34[iVar35 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar82 - fVar70)));
        *pfVar40 = (fVar73 - fVar5) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar82 - fVar70)));
        *pfVar48 = auVar50._0_4_ - (fVar73 - fVar5);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x68);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x68);
      if (((iVar45 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar19 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar45,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar26 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar35 = iVar37 * iVar20;
        fVar63 = pfVar34[iVar37 * iVar21 + -1 + iVar31];
        iVar33 = iVar37 * (iVar1 + -1 + iVar45);
        fVar73 = pfVar34[iVar33 + -1 + iVar31];
        fVar82 = pfVar34[iVar33 + -1 + iVar22];
        fVar70 = pfVar34[iVar35 + -1 + iVar31];
        fVar5 = pfVar34[iVar35 + -1 + iVar22];
        fVar6 = pfVar34[iVar37 * iVar21 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar26] - pfVar34[iVar33 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar82 - fVar70)));
        *pfVar40 = (fVar73 - fVar5) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar82 - fVar70)));
        *pfVar48 = auVar50._0_4_ - (fVar73 - fVar5);
      }
      iVar31 = (int)((double)((ulong)(0.0 <= fVar69) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar69) * -0x4020000000000000) + (double)fVar69);
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0xc);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0xc);
      if ((((iVar43 < 1) || (iVar31 < 1)) || (iimage->height < iVar16)) ||
         (iVar22 = iVar1 + iVar31, iimage->width < iVar22)) {
        haarXY(iimage,iVar43,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar33 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar26 = iVar37 * iVar17;
        fVar63 = pfVar34[iVar37 * iVar18 + -1 + iVar31];
        iVar35 = iVar37 * (iVar1 + -1 + iVar43);
        fVar69 = pfVar34[iVar35 + -1 + iVar31];
        fVar73 = pfVar34[iVar35 + -1 + iVar22];
        fVar82 = pfVar34[iVar26 + -1 + iVar31];
        fVar70 = pfVar34[iVar26 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar18 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar26 + iVar33] - pfVar34[iVar35 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x6c);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x6c);
      if (((iVar45 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar19 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar45,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar26 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar35 = iVar37 * iVar20;
        fVar63 = pfVar34[iVar37 * iVar21 + -1 + iVar31];
        iVar33 = iVar37 * (iVar1 + -1 + iVar45);
        fVar69 = pfVar34[iVar33 + -1 + iVar31];
        fVar73 = pfVar34[iVar33 + -1 + iVar22];
        fVar82 = pfVar34[iVar35 + -1 + iVar31];
        fVar70 = pfVar34[iVar35 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar21 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar26] - pfVar34[iVar33 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      auVar50 = vpbroadcastd_avx512vl();
      auVar50 = vpaddd_avx(auVar50,_DAT_005766f0);
      auVar50 = vcvtdq2ps_avx(auVar50);
      auVar15._4_4_ = fVar3;
      auVar15._0_4_ = fVar3;
      auVar15._8_4_ = fVar3;
      auVar15._12_4_ = fVar3;
      auVar14._4_4_ = fVar64;
      auVar14._0_4_ = fVar64;
      auVar14._8_4_ = fVar64;
      auVar14._12_4_ = fVar64;
      auVar52 = vfmadd132ps_fma(auVar50,auVar15,auVar14);
      auVar50 = vshufps_avx(auVar52,auVar52,0xff);
      uVar24 = vcmpps_avx512vl(auVar52,_DAT_00576190,0xd);
      bVar49 = (byte)(uVar24 >> 3);
      iVar31 = (int)((double)((ulong)(bVar49 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar49 & 1) * -0x4020000000000000) +
                    (double)auVar50._0_4_);
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x10);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x10);
      if (((iVar43 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar16 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar43,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar33 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar26 = iVar37 * iVar17;
        fVar63 = pfVar34[iVar37 * iVar18 + -1 + iVar31];
        iVar35 = iVar37 * (iVar1 + -1 + iVar43);
        fVar69 = pfVar34[iVar35 + -1 + iVar31];
        fVar73 = pfVar34[iVar35 + -1 + iVar22];
        fVar82 = pfVar34[iVar26 + -1 + iVar31];
        fVar70 = pfVar34[iVar26 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar18 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar26 + iVar33] - pfVar34[iVar35 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x70);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x70);
      if ((((iVar45 < 1) || (iVar31 < 1)) || (iimage->height < iVar19)) ||
         (iVar22 = iVar1 + iVar31, iimage->width < iVar22)) {
        haarXY(iimage,iVar45,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar26 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar35 = iVar37 * iVar20;
        fVar63 = pfVar34[iVar37 * iVar21 + -1 + iVar31];
        iVar33 = iVar37 * (iVar1 + -1 + iVar45);
        fVar69 = pfVar34[iVar33 + -1 + iVar31];
        fVar73 = pfVar34[iVar33 + -1 + iVar22];
        fVar82 = pfVar34[iVar35 + -1 + iVar31];
        fVar70 = pfVar34[iVar35 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar21 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar26] - pfVar34[iVar33 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      bVar49 = (byte)uVar24;
      auVar50 = vpermilpd_avx(auVar52,1);
      iVar31 = (int)((double)((ulong)(bVar49 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar49 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar50._0_4_);
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x14);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x14);
      if (((iVar43 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar16 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar43,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar33 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar26 = iVar37 * iVar17;
        fVar63 = pfVar34[iVar37 * iVar18 + -1 + iVar31];
        iVar35 = iVar37 * (iVar1 + -1 + iVar43);
        fVar69 = pfVar34[iVar35 + -1 + iVar31];
        fVar73 = pfVar34[iVar35 + -1 + iVar22];
        fVar82 = pfVar34[iVar26 + -1 + iVar31];
        fVar70 = pfVar34[iVar26 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar18 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar26 + iVar33] - pfVar34[iVar35 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x74);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x74);
      if (((iVar45 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar19 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar45,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar26 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar35 = iVar37 * iVar20;
        fVar63 = pfVar34[iVar37 * iVar21 + -1 + iVar31];
        iVar33 = iVar37 * (iVar1 + -1 + iVar45);
        fVar69 = pfVar34[iVar33 + -1 + iVar31];
        fVar73 = pfVar34[iVar33 + -1 + iVar22];
        fVar82 = pfVar34[iVar35 + -1 + iVar31];
        fVar70 = pfVar34[iVar35 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar21 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar26] - pfVar34[iVar33 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      auVar50 = vmovshdup_avx(auVar52);
      iVar31 = (int)((double)((ulong)(bVar49 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar49 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar50._0_4_);
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x18);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x18);
      if ((((iVar43 < 1) || (iVar31 < 1)) || (iimage->height < iVar16)) ||
         (iVar22 = iVar1 + iVar31, iimage->width < iVar22)) {
        haarXY(iimage,iVar43,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar33 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar26 = iVar37 * iVar17;
        fVar63 = pfVar34[iVar37 * iVar18 + -1 + iVar31];
        iVar35 = iVar37 * (iVar1 + -1 + iVar43);
        fVar69 = pfVar34[iVar35 + -1 + iVar31];
        fVar73 = pfVar34[iVar35 + -1 + iVar22];
        fVar82 = pfVar34[iVar26 + -1 + iVar31];
        fVar70 = pfVar34[iVar26 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar18 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar26 + iVar33] - pfVar34[iVar35 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x78);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x78);
      if (((iVar45 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar19 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar45,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar26 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar35 = iVar37 * iVar20;
        fVar63 = pfVar34[iVar37 * iVar21 + -1 + iVar31];
        iVar33 = iVar37 * (iVar1 + -1 + iVar45);
        fVar69 = pfVar34[iVar33 + -1 + iVar31];
        fVar73 = pfVar34[iVar33 + -1 + iVar22];
        fVar82 = pfVar34[iVar35 + -1 + iVar31];
        fVar70 = pfVar34[iVar35 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar21 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar26] - pfVar34[iVar33 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      local_108 = auVar52._0_4_;
      iVar31 = (int)((double)((ulong)(bVar49 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar49 & 1) * -0x4020000000000000) + (double)local_108);
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x1c);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x1c);
      if (((iVar43 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar16 || (iVar22 = iVar1 + iVar31, iimage->width < iVar22)))) {
        haarXY(iimage,iVar43,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar33 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar26 = iVar37 * iVar17;
        fVar63 = pfVar34[iVar37 * iVar18 + -1 + iVar31];
        iVar35 = iVar37 * (iVar1 + -1 + iVar43);
        fVar69 = pfVar34[iVar35 + -1 + iVar31];
        fVar73 = pfVar34[iVar35 + -1 + iVar22];
        fVar82 = pfVar34[iVar26 + -1 + iVar31];
        fVar70 = pfVar34[iVar26 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar18 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar26 + iVar33] - pfVar34[iVar35 + iVar33]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      pfVar40 = (float *)((long)haarResponseX + lVar28 + 0x7c);
      pfVar48 = (float *)((long)haarResponseY + lVar28 + 0x7c);
      if ((((iVar45 < 1) || (iVar31 < 1)) || (iimage->height < iVar19)) ||
         (iVar22 = iVar1 + iVar31, iimage->width < iVar22)) {
        haarXY(iimage,iVar45,iVar31,iVar38,pfVar40,pfVar48);
      }
      else {
        iVar26 = iVar31 + -1 + iVar38;
        pfVar34 = iimage->data;
        iVar37 = iimage->data_width;
        iVar35 = iVar37 * iVar20;
        fVar63 = pfVar34[iVar37 * iVar21 + -1 + iVar31];
        iVar33 = iVar37 * (iVar1 + -1 + iVar45);
        fVar69 = pfVar34[iVar33 + -1 + iVar31];
        fVar73 = pfVar34[iVar33 + -1 + iVar22];
        fVar82 = pfVar34[iVar35 + -1 + iVar31];
        fVar70 = pfVar34[iVar35 + -1 + iVar22];
        fVar5 = pfVar34[iVar37 * iVar21 + -1 + iVar22];
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar34[iVar35 + iVar26] - pfVar34[iVar33 + iVar26]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar40 = (fVar69 - fVar70) + auVar50._0_4_;
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar73 - fVar82)));
        *pfVar48 = auVar50._0_4_ - (fVar69 - fVar70);
      }
      auVar94 = ZEXT1664(auVar51);
      lVar28 = lVar28 + 0x20;
      bVar2 = iVar47 < 4;
      iVar47 = iVar47 + 8;
    } while (bVar2);
    lVar29 = lVar29 + 0xc0;
    bVar2 = (int)uVar23 < 10;
    uVar23 = uVar23 + 2;
  } while (bVar2);
LAB_001c6ab7:
  fVar64 = auVar94._0_4_;
  auVar93._8_4_ = 0x3effffff;
  auVar93._0_8_ = 0x3effffff3effffff;
  auVar93._12_4_ = 0x3effffff;
  auVar92._8_4_ = 0x80000000;
  auVar92._0_8_ = 0x8000000080000000;
  auVar92._12_4_ = 0x80000000;
  auVar50 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 0.5)),auVar92,0xf8);
  auVar50 = ZEXT416((uint)(fVar64 * 0.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 1.5)),auVar92,0xf8);
  auVar51 = ZEXT416((uint)(fVar64 * 1.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar53 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 2.5)),auVar92,0xf8);
  auVar53 = ZEXT416((uint)(fVar64 * 2.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar52 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 3.5)),auVar92,0xf8);
  auVar52 = ZEXT416((uint)(fVar64 * 3.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar54 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 4.5)),auVar92,0xf8);
  auVar54 = ZEXT416((uint)(fVar64 * 4.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 5.5)),auVar92,0xf8);
  auVar55 = ZEXT416((uint)(fVar64 * 5.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 6.5)),auVar92,0xf8);
  auVar56 = ZEXT416((uint)(fVar64 * 6.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 7.5)),auVar92,0xf8);
  auVar57 = ZEXT416((uint)(auVar57._0_4_ + fVar64 * 7.5));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 8.5)),auVar92,0xf8);
  auVar58 = ZEXT416((uint)(fVar64 * 8.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 9.5)),auVar92,0xf8);
  auVar59 = ZEXT416((uint)(fVar64 * 9.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 10.5)),auVar92,0xf8);
  auVar60 = ZEXT416((uint)(fVar64 * 10.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar93,ZEXT416((uint)(fVar64 * 11.5)),auVar92,0xf8);
  auVar61 = ZEXT416((uint)(fVar64 * 11.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  fVar70 = auVar53._0_4_;
  fVar64 = fVar70 + auVar51._0_4_;
  fVar3 = fVar70 + auVar50._0_4_;
  fVar4 = fVar70 - auVar50._0_4_;
  fVar63 = fVar70 - auVar51._0_4_;
  fVar69 = fVar70 - auVar52._0_4_;
  fVar73 = fVar70 - auVar54._0_4_;
  fVar82 = fVar70 - auVar55._0_4_;
  fVar70 = fVar70 - auVar56._0_4_;
  fVar90 = auVar57._0_4_;
  fVar5 = fVar90 - auVar52._0_4_;
  fVar6 = fVar90 - auVar54._0_4_;
  fVar7 = fVar90 - auVar55._0_4_;
  fVar8 = fVar90 - auVar56._0_4_;
  fVar9 = fVar90 - auVar58._0_4_;
  fVar10 = fVar90 - auVar59._0_4_;
  fVar11 = fVar90 - auVar60._0_4_;
  fVar90 = fVar90 - auVar61._0_4_;
  gauss_s1_c0[0] = expf(fVar64 * fVar64 * fVar62);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar62);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar62);
  gauss_s1_c0[3] = expf(fVar63 * fVar63 * fVar62);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar69 * fVar69 * fVar62);
  gauss_s1_c0[6] = expf(fVar73 * fVar73 * fVar62);
  gauss_s1_c0[7] = expf(fVar82 * fVar82 * fVar62);
  gauss_s1_c0[8] = expf(fVar70 * fVar70 * fVar62);
  gauss_s1_c1[0] = expf(fVar5 * fVar5 * fVar62);
  gauss_s1_c1[1] = expf(fVar6 * fVar6 * fVar62);
  gauss_s1_c1[2] = expf(fVar7 * fVar7 * fVar62);
  gauss_s1_c1[3] = expf(fVar8 * fVar8 * fVar62);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar9 * fVar9 * fVar62);
  gauss_s1_c1[6] = expf(fVar10 * fVar10 * fVar62);
  gauss_s1_c1[7] = expf(fVar11 * fVar11 * fVar62);
  gauss_s1_c1[8] = expf(fVar90 * fVar90 * fVar62);
  uVar24 = 0xfffffff8;
  lVar29 = 0;
  fVar64 = 0.0;
  auVar68._8_4_ = 0x7fffffff;
  auVar68._0_8_ = 0x7fffffff7fffffff;
  auVar68._12_4_ = 0x7fffffff;
  lVar28 = 0;
  lVar41 = 0;
  do {
    pfVar40 = gauss_s1_c1;
    uVar23 = (uint)uVar24;
    if (uVar23 != 7) {
      pfVar40 = gauss_s1_c0;
    }
    if (uVar23 == 0xfffffff8) {
      pfVar40 = gauss_s1_c1;
    }
    lVar28 = (long)(int)lVar28;
    iVar38 = (int)lVar41;
    lVar41 = (long)iVar38;
    lVar39 = (long)haarResponseX + lVar29;
    lVar30 = (long)haarResponseY + lVar29;
    uVar36 = 0xfffffff8;
    uVar32 = 0;
    do {
      pfVar48 = gauss_s1_c1;
      if (uVar36 != 7) {
        pfVar48 = gauss_s1_c0;
      }
      if (uVar36 == 0xfffffff8) {
        pfVar48 = gauss_s1_c1;
      }
      uVar25 = (ulong)(uVar36 >> 0x1c & 0xfffffff8);
      auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar27 = uVar32;
      lVar44 = lVar39;
      lVar46 = lVar30;
      do {
        lVar42 = 0;
        pfVar34 = (float *)((long)pfVar40 + (ulong)(uint)((int)(uVar24 >> 0x1f) << 5));
        do {
          fVar3 = pfVar48[uVar25] * *pfVar34;
          auVar50 = vinsertps_avx(ZEXT416(*(uint *)(lVar46 + lVar42 * 4)),
                                  ZEXT416(*(uint *)(lVar44 + lVar42 * 4)),0x10);
          auVar84._0_4_ = fVar3 * auVar50._0_4_;
          auVar84._4_4_ = fVar3 * auVar50._4_4_;
          auVar84._8_4_ = fVar3 * auVar50._8_4_;
          auVar84._12_4_ = fVar3 * auVar50._12_4_;
          auVar50 = vandps_avx(auVar84,auVar68);
          auVar50 = vmovlhps_avx(auVar84,auVar50);
          auVar72._0_4_ = auVar88._0_4_ + auVar50._0_4_;
          auVar72._4_4_ = auVar88._4_4_ + auVar50._4_4_;
          auVar72._8_4_ = auVar88._8_4_ + auVar50._8_4_;
          auVar72._12_4_ = auVar88._12_4_ + auVar50._12_4_;
          auVar88 = ZEXT1664(auVar72);
          pfVar34 = pfVar34 + (ulong)(~uVar23 >> 0x1f) * 2 + -1;
          lVar42 = lVar42 + 1;
        } while (lVar42 != 9);
        uVar27 = uVar27 + 0x18;
        uVar25 = uVar25 + (ulong)(-1 < (int)uVar36) * 2 + -1;
        lVar44 = lVar44 + 0x60;
        lVar46 = lVar46 + 0x60;
      } while (uVar27 < uVar36 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar41];
      auVar13._4_4_ = fVar3;
      auVar13._0_4_ = fVar3;
      auVar13._8_4_ = fVar3;
      auVar13._12_4_ = fVar3;
      auVar53 = vmulps_avx512vl(auVar72,auVar13);
      lVar41 = lVar41 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar28) = auVar53;
      auVar75._0_4_ = auVar53._0_4_ * auVar53._0_4_;
      auVar75._4_4_ = auVar53._4_4_ * auVar53._4_4_;
      auVar75._8_4_ = auVar53._8_4_ * auVar53._8_4_;
      auVar75._12_4_ = auVar53._12_4_ * auVar53._12_4_;
      auVar50 = vmovshdup_avx(auVar75);
      auVar51 = vfmadd231ss_fma(auVar50,auVar53,auVar53);
      auVar50 = vshufpd_avx(auVar53,auVar53,1);
      auVar51 = vfmadd213ss_fma(auVar50,auVar50,auVar51);
      auVar50 = vshufps_avx(auVar53,auVar53,0xff);
      auVar50 = vfmadd213ss_fma(auVar50,auVar50,auVar51);
      fVar64 = fVar64 + auVar50._0_4_;
      lVar28 = lVar28 + 4;
      uVar36 = uVar36 + 5;
      uVar32 = uVar32 + 0x78;
      lVar39 = lVar39 + 0x1e0;
      lVar30 = lVar30 + 0x1e0;
    } while (iVar38 + 4 != (int)lVar41);
    lVar29 = lVar29 + 0x14;
    uVar24 = (ulong)(uVar23 + 5);
  } while ((int)uVar23 < 3);
  if (fVar64 < 0.0) {
    fVar64 = sqrtf(fVar64);
  }
  else {
    auVar50 = vsqrtss_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
    fVar64 = auVar50._0_4_;
  }
  auVar88 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar64)));
  lVar29 = 0;
  do {
    auVar91 = vmulps_avx512f(auVar88,*(undefined1 (*) [64])(ipoint->descriptor + lVar29));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar29) = auVar91;
    lVar29 = lVar29 + 0x10;
  } while (lVar29 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_8_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}